

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

int TabItemComparerBySection(void *lhs,void *rhs)

{
  undefined4 local_38;
  undefined4 local_34;
  int b_section;
  int a_section;
  ImGuiTabItem *b;
  ImGuiTabItem *a;
  void *rhs_local;
  void *lhs_local;
  undefined4 local_4;
  
  if ((*(uint *)((long)lhs + 4) & 0x40) == 0) {
    local_34 = 1;
    if ((*(uint *)((long)lhs + 4) & 0x80) != 0) {
      local_34 = 2;
    }
  }
  else {
    local_34 = 0;
  }
  if ((*(uint *)((long)rhs + 4) & 0x40) == 0) {
    local_38 = 1;
    if ((*(uint *)((long)rhs + 4) & 0x80) != 0) {
      local_38 = 2;
    }
  }
  else {
    local_38 = 0;
  }
  if (local_34 == local_38) {
    local_4 = (int)*(short *)((long)lhs + 0x20) - (int)*(short *)((long)rhs + 0x20);
  }
  else {
    local_4 = local_34 - local_38;
  }
  return local_4;
}

Assistant:

static int IMGUI_CDECL TabItemComparerBySection(const void* lhs, const void* rhs)
{
    const ImGuiTabItem* a = (const ImGuiTabItem*)lhs;
    const ImGuiTabItem* b = (const ImGuiTabItem*)rhs;
    const int a_section = (a->Flags & ImGuiTabItemFlags_Leading) ? 0 : (a->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
    const int b_section = (b->Flags & ImGuiTabItemFlags_Leading) ? 0 : (b->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
    if (a_section != b_section)
        return a_section - b_section;
    return (int)(a->IndexDuringLayout - b->IndexDuringLayout);
}